

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::BitstringAggBindData::Deserialize(Deserializer *deserializer,AggregateFunction *param_2)

{
  _func_int **pp_Var1;
  Value val;
  Value max;
  Value min;
  LogicalType local_150;
  Value local_138;
  LogicalType local_f8;
  Value local_e0;
  Value local_a0;
  Value local_60;
  
  LogicalType::LogicalType(&local_f8,SQLNULL);
  Value::Value(&local_a0,&local_f8);
  LogicalType::~LogicalType(&local_f8);
  LogicalType::LogicalType(&local_150,SQLNULL);
  Value::Value(&local_e0,&local_150);
  LogicalType::~LogicalType(&local_150);
  (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[2])
            (param_2,100,"min");
  (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[6])
            (param_2);
  Value::Deserialize(&local_138,(Deserializer *)param_2);
  (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[7])
            (param_2);
  Value::operator=(&local_a0,&local_138);
  Value::~Value(&local_138);
  (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[3])
            (param_2);
  (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[2])
            (param_2,0x65,"max");
  (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[6])
            (param_2);
  Value::Deserialize(&local_138,(Deserializer *)param_2);
  (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[7])
            (param_2);
  Value::operator=(&local_e0,&local_138);
  Value::~Value(&local_138);
  (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[3])
            (param_2);
  pp_Var1 = (_func_int **)operator_new(0x88);
  Value::Value(&local_138,&local_a0);
  Value::Value(&local_60,&local_e0);
  *pp_Var1 = (_func_int *)&PTR__BitstringAggBindData_024bcdc0;
  Value::Value((Value *)(pp_Var1 + 1),&local_138);
  Value::Value((Value *)(pp_Var1 + 9),&local_60);
  Value::~Value(&local_60);
  Value::~Value(&local_138);
  deserializer->_vptr_Deserializer = pp_Var1;
  Value::~Value(&local_e0);
  Value::~Value(&local_a0);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)deserializer;
}

Assistant:

static unique_ptr<FunctionData> Deserialize(Deserializer &deserializer, AggregateFunction &) {
		Value min;
		Value max;
		deserializer.ReadProperty(100, "min", min);
		deserializer.ReadProperty(101, "max", max);
		return make_uniq<BitstringAggBindData>(min, max);
	}